

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.c
# Opt level: O2

int func_extract(int ip)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  int iVar5;
  char *pcVar6;
  byte bVar7;
  char *stptr;
  int iVar8;
  int iVar9;
  
  ppuVar4 = __ctype_b_loc();
  iVar8 = ip + -1;
  pcVar6 = prlnbuf + ip;
  do {
    cVar1 = *pcVar6;
    iVar8 = iVar8 + 1;
    pcVar6 = pcVar6 + 1;
  } while ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
  iVar5 = 0;
  pcVar6 = func_line;
  stptr = "Invalid function argument!";
  iVar3 = 0;
  bVar2 = false;
  do {
    if (bVar2) {
      return iVar3;
    }
    bVar7 = prlnbuf[iVar8];
    iVar9 = iVar8 + 1;
    if (bVar7 == 0) {
LAB_0010c411:
      *pcVar6 = 0;
      bVar2 = true;
      iVar8 = iVar9;
    }
    else {
      if (bVar7 == 0x5c) {
        *pcVar6 = 0x5c;
        bVar7 = prlnbuf[(long)iVar8 + 1];
        if ((byte)(bVar7 - 0x3a) < 0xf7) goto LAB_0010c45b;
        iVar8 = iVar8 + 2;
        iVar5 = iVar5 + 1;
        pcVar6 = (char *)((byte *)pcVar6 + 1);
        if (iVar3 <= (int)(bVar7 - 0x31)) {
          iVar3 = bVar7 - 0x31;
        }
      }
      else {
        iVar8 = iVar9;
        if (bVar7 == 0x3b) goto LAB_0010c411;
      }
      *pcVar6 = bVar7;
      iVar5 = iVar5 + 1;
      bVar2 = false;
      if (iVar5 == 0x7f) {
        stptr = "Function line too long!";
LAB_0010c45b:
        error(stptr);
        return -1;
      }
    }
    pcVar6 = (char *)((byte *)pcVar6 + 1);
  } while( true );
}

Assistant:

int
func_extract(int ip)
{
	char *ptr;
	char  c;
	int   i, arg, max_arg;
	int   end;

	/* skip spaces */
	while (isspace(prlnbuf[ip]))
		ip++;

	/* get function body */
	ptr = func_line;
	max_arg = 0;
	end = 0;
	i = 0;

	while (!end) {
		c = prlnbuf[ip++];
		switch (c) {
		/* end of line */	
		case ';':
		case '\0':
		   *ptr++ = '\0';
			end = 1;
			break;

		/* function arg */
		case '\\':
		   *ptr++ = c;
		    i++;
			c = prlnbuf[ip++];
			if ((c < '1') || (c > '9')) {
				error("Invalid function argument!");
				return (-1);
			}
			arg = c - '1';
			if (max_arg < arg)
				max_arg = arg;

		/* other */
		default:
		   *ptr++ = c;
		    i++;
			if (i == 127) {
				error("Function line too long!");
				return (-1);
			}
			break;
		}
	}

	/* return the number of args */
	return (max_arg);
}